

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# body.cc
# Opt level: O0

void __thiscall
apollonia::PolygonBody::PolygonBody(PolygonBody *this,Float mass,VertexList *vertices)

{
  Float inertia;
  Vec2 local_34 [2];
  vector<apollonia::Vec2,_std::allocator<apollonia::Vec2>_> *local_20;
  VertexList *vertices_local;
  PolygonBody *pPStack_10;
  Float mass_local;
  PolygonBody *this_local;
  
  local_20 = vertices;
  vertices_local._4_4_ = mass;
  pPStack_10 = this;
  Body::Body(&this->super_Body,mass);
  (this->super_Body)._vptr_Body = (_func_int **)&PTR__PolygonBody_00170cc0;
  std::vector<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>::vector(&this->vertices_,local_20);
  inertia = PolygonInertia(vertices_local._4_4_,local_20);
  Body::set_inertia(&this->super_Body,inertia);
  local_34[0] = PolygonCentroid(local_20);
  Body::set_centroid(&this->super_Body,local_34);
  return;
}

Assistant:

PolygonBody::PolygonBody(Float mass, const VertexList& vertices)
    : Body(mass), vertices_(vertices) {
  set_inertia(PolygonInertia(mass, vertices));
  set_centroid(PolygonCentroid(vertices));
}